

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unite.hpp
# Opt level: O3

iterator_range<burst::union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>_>
* __thiscall
burst::unite_t::operator()
          (iterator_range<burst::union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>_>
           *__return_storage_ptr__,unite_t *this,
          tuple<const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
          *args,greater<void> *args_1)

{
  union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
  end;
  union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
  begin;
  union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
  local_138;
  undefined8 local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d8;
  undefined8 local_d0;
  union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
  local_b8;
  undefined8 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  undefined8 local_68;
  undefined8 local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_58;
  undefined8 local_50;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  initializer_list<int> *local_28;
  
  local_38 = *(undefined4 *)
              &(args->
               super__Tuple_impl<0UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
               ).
               super__Tuple_impl<1UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
               .super__Tuple_impl<2UL,_const_std::initializer_list<int>_&>.
               super__Head_base<2UL,_const_std::initializer_list<int>_&,_false>._M_head_impl;
  uStack_34 = *(undefined4 *)
               ((long)&(args->
                       super__Tuple_impl<0UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
                       ).
                       super__Tuple_impl<1UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
                       .super__Tuple_impl<2UL,_const_std::initializer_list<int>_&>.
                       super__Head_base<2UL,_const_std::initializer_list<int>_&,_false>._M_head_impl
               + 4);
  uStack_30 = *(undefined4 *)
               &(args->
                super__Tuple_impl<0UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
                ).
                super__Tuple_impl<1UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
                .super__Head_base<1UL,_const_std::initializer_list<int>_&,_false>._M_head_impl;
  uStack_2c = *(undefined4 *)
               ((long)&(args->
                       super__Tuple_impl<0UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
                       ).
                       super__Tuple_impl<1UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
                       .super__Head_base<1UL,_const_std::initializer_list<int>_&,_false>.
                       _M_head_impl + 4);
  local_28 = (args->
             super__Tuple_impl<0UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
             ).super__Head_base<0UL,_const_std::initializer_list<int>_&,_false>._M_head_impl;
  make_union_iterator<std::initializer_list<int>const,std::initializer_list<int>const,std::initializer_list<int>const,std::greater<void>>
            (&local_78);
  union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
  ::union_iterator(&local_b8,&local_78);
  local_f8 = local_78;
  p_Stack_f0 = p_Stack_70;
  local_78 = 0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8 = local_68;
  local_e0 = local_60;
  p_Stack_d8 = p_Stack_58;
  local_60 = 0;
  p_Stack_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d0 = local_50;
  local_138.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_b8.m_begin.m_container.
            super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_138.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_b8.m_begin.m_container.
       super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_b8.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_b8.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_138.m_begin.m_iterator._M_current = local_b8.m_begin.m_iterator._M_current;
  local_138.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_b8.m_end.m_container.
            super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_138.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_b8.m_end.m_container.
       super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_b8.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_b8.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_138.m_end.m_iterator._M_current = local_b8.m_end.m_iterator._M_current;
  boost::
  make_iterator_range<burst::union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,std::greater<void>>>
            (__return_storage_ptr__,(boost *)&local_f8,&local_138,
             (union_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
              *)args_1);
  if (local_138.m_end.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.m_end.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138.m_begin.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.m_begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (p_Stack_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d8);
  }
  if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
  }
  if (local_b8.m_end.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.m_end.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b8.m_begin.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.m_begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (p_Stack_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_58);
  }
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_union_iterator(std::forward<Args>(args)...);
            auto end = make_union_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }